

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

unsigned_long ndiGetBXFrame(ndicapi *pol,int portHandle)

{
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (pol->BxHandleCount == uVar1) {
      return 0;
    }
    if (pol->BxHandles[uVar1] == portHandle) break;
    uVar1 = uVar1 + 1;
  }
  if (pol->BxHandleCount != uVar1) {
    return (ulong)pol->BxFrameNumber[uVar1];
  }
  return 0;
}

Assistant:

ndicapiExport unsigned long ndiGetBXFrame(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->BxFrameNumber[i];
}